

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O2

Gia_Man_t * Bmcg_ManUnfold(Bmcg_Man_t *p,int f,int nFramesAdd)

{
  Gia_Man_t **p_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__s;
  undefined4 *puVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  uint uVar11;
  int Fill;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  int iVar13;
  int iVar14;
  size_t __size;
  ulong uVar12;
  
  pGVar8 = p->pFrames;
  uVar11 = pGVar8->vCos->nSize - pGVar8->nRegs;
  uVar12 = (ulong)uVar11;
  if (uVar11 != (p->pGia->vCos->nSize - p->pGia->nRegs) * f) {
    __assert_fail("Gia_ManPoNum(p->pFrames) == f * Gia_ManPoNum(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcG.c"
                  ,0xc0,"Gia_Man_t *Bmcg_ManUnfold(Bmcg_Man_t *, int, int)");
  }
  iVar10 = pGVar8->nObjs;
  iVar5 = 0;
  if (nFramesAdd < 1) {
    nFramesAdd = iVar5;
  }
  bVar1 = true;
  while( true ) {
    if (iVar5 == nFramesAdd) {
      pGVar8 = (Gia_Man_t *)0x0;
      if (!bVar1) {
        Vec_IntFillExtra(&p->vFr2Sat,p->pFrames->nObjs,(int)uVar12);
        Vec_IntFillExtra(&p->pFrames->vCopies,p->pFrames->nObjs,Fill);
        p_00 = &p->pClean;
        Gia_ManStopP(p_00);
        pGVar8 = Gia_ManStart((p->pFrames->nObjs - iVar10) + 1000);
        p->pClean = pGVar8;
        Vec_IntWriteEntry(&p->pFrames->vCopies,0,0);
        for (iVar10 = 0; iVar10 != nFramesAdd; iVar10 = iVar10 + 1) {
          for (iVar5 = 0; iVar14 = p->pGia->vCos->nSize - p->pGia->nRegs, iVar5 < iVar14;
              iVar5 = iVar5 + 1) {
            pGVar7 = Gia_ManCo(p->pFrames,iVar14 * f + iVar5);
            iVar14 = Gia_ObjFaninId0p(p->pFrames,pGVar7);
            iVar14 = Bmcg_ManCollect_rec(p,iVar14);
            iVar14 = Abc_LitNotCond(iVar14,*(uint *)pGVar7 >> 0x1d & 1);
            iVar14 = Gia_ManAppendCo(p->pClean,iVar14);
            uVar11 = Gia_ObjId(p->pFrames,pGVar7);
            pGVar8 = p->pClean;
            iVar13 = Abc_Lit2Var(iVar14);
            pGVar9 = Gia_ManObj(pGVar8,iVar13);
            pGVar9->Value = uVar11;
            pGVar8 = p->pFrames;
            iVar13 = Gia_ObjId(pGVar8,pGVar7);
            Vec_IntWriteEntry(&pGVar8->vCopies,iVar13,iVar14);
          }
          f = f + 1;
        }
        pGVar8 = *p_00;
        *p_00 = (Gia_Man_t *)0x0;
        iVar10 = 0;
        while ((iVar10 < pGVar8->nObjs &&
               (pGVar7 = Gia_ManObj(pGVar8,iVar10), pGVar7 != (Gia_Obj_t *)0x0))) {
          Vec_IntWriteEntry(&p->pFrames->vCopies,pGVar7->Value,-1);
          iVar10 = iVar10 + 1;
        }
      }
      return pGVar8;
    }
    __size = (long)p->pGia->nObjs << 2;
    __s = malloc(__size);
    memset(__s,0xff,__size);
    iVar14 = (p->vGia2Fr).nSize;
    if (iVar14 == (p->vGia2Fr).nCap) {
      iVar13 = iVar14 * 2;
      if (iVar14 < 0x10) {
        iVar13 = 0x10;
      }
      Vec_PtrGrow(&p->vGia2Fr,iVar13);
      iVar14 = (p->vGia2Fr).nSize;
    }
    (p->vGia2Fr).nSize = iVar14 + 1;
    (p->vGia2Fr).pArray[iVar14] = __s;
    if (iVar14 != f + iVar5) break;
    puVar6 = (undefined4 *)Vec_PtrEntry(&p->vGia2Fr,iVar14);
    *puVar6 = 0;
    iVar13 = 0;
    uVar12 = extraout_RDX;
    while ((pGVar8 = p->pGia, iVar13 < pGVar8->vCos->nSize - pGVar8->nRegs &&
           (pGVar7 = Gia_ManCo(pGVar8,iVar13), uVar12 = extraout_RDX_00, pGVar7 != (Gia_Obj_t *)0x0)
           )) {
      iVar2 = Gia_ObjFaninId0p(p->pGia,pGVar7);
      iVar2 = Bmcg_ManUnfold_rec(p,iVar2,iVar14);
      iVar2 = Abc_LitNotCond(iVar2,*(uint *)pGVar7 >> 0x1d & 1);
      iVar3 = Gia_ManAppendCo(p->pFrames,iVar2);
      iVar4 = Gia_ObjId(p->pGia,pGVar7);
      puVar6[iVar4] = iVar3;
      bVar1 = (bool)(bVar1 & iVar2 == 0);
      iVar13 = iVar13 + 1;
      uVar12 = extraout_RDX_01;
    }
    iVar5 = iVar5 + 1;
  }
  __assert_fail("Vec_PtrSize(&p->vGia2Fr) == f+k+1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcG.c"
                ,0xc5,"Gia_Man_t *Bmcg_ManUnfold(Bmcg_Man_t *, int, int)");
}

Assistant:

Gia_Man_t * Bmcg_ManUnfold( Bmcg_Man_t * p, int f, int nFramesAdd )
{
    Gia_Man_t * pNew = NULL; Gia_Obj_t * pObj;
    int i, k, iLitFrame, iLitClean, fTrivial = 1;
    int * pCopies, nFrameObjs = Gia_ManObjNum(p->pFrames);
    assert( Gia_ManPoNum(p->pFrames) == f * Gia_ManPoNum(p->pGia) );
    for ( k = 0; k < nFramesAdd; k++ )
    {
        // unfold this timeframe
        Vec_PtrPush( &p->vGia2Fr, ABC_FALLOC(int, Gia_ManObjNum(p->pGia)) );
        assert( Vec_PtrSize(&p->vGia2Fr) == f+k+1 );
        pCopies = Bmcg_ManCopies( p, f+k );
        //memset( pCopies, 0xFF, sizeof(int)*Gia_ManObjNum(p->pGia) );  
        pCopies[0] = 0;
        Gia_ManForEachPo( p->pGia, pObj, i )
        {
            iLitFrame = Bmcg_ManUnfold_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), f+k );
            iLitFrame = Abc_LitNotCond( iLitFrame, Gia_ObjFaninC0(pObj) );
            pCopies[Gia_ObjId(p->pGia, pObj)] = Gia_ManAppendCo( p->pFrames, iLitFrame );
            fTrivial &= (iLitFrame == 0);
        }
    }
    if ( fTrivial )
        return NULL;
    // create a clean copy of the new nodes of this timeframe
    Vec_IntFillExtra( &p->vFr2Sat, Gia_ManObjNum(p->pFrames), -1 );
    Vec_IntFillExtra( &p->pFrames->vCopies, Gia_ManObjNum(p->pFrames), -1 );
    //assert( Vec_IntCountEntry(&p->pFrames->vCopies, -1) == Vec_IntSize(&p->pFrames->vCopies) );
    Gia_ManStopP( &p->pClean );
    p->pClean = Gia_ManStart( Gia_ManObjNum(p->pFrames) - nFrameObjs + 1000 );
    Gia_ObjSetCopyArray( p->pFrames, 0, 0 );
    for ( k = 0; k < nFramesAdd; k++ )
    for ( i = 0; i < Gia_ManPoNum(p->pGia); i++ )
    {
        pObj = Gia_ManCo( p->pFrames, (f+k) * Gia_ManPoNum(p->pGia) + i );
        iLitClean = Bmcg_ManCollect_rec( p, Gia_ObjFaninId0p(p->pFrames, pObj) );
        iLitClean = Abc_LitNotCond( iLitClean, Gia_ObjFaninC0(pObj) );
        iLitClean = Gia_ManAppendCo( p->pClean, iLitClean );
        Gia_ManObj( p->pClean, Abc_Lit2Var(iLitClean) )->Value = Gia_ObjId(p->pFrames, pObj);
        Gia_ObjSetCopyArray( p->pFrames, Gia_ObjId(p->pFrames, pObj), iLitClean );
    }
    pNew = p->pClean; p->pClean = NULL;
    Gia_ManForEachObj( pNew, pObj, i )
        Gia_ObjSetCopyArray( p->pFrames, pObj->Value, -1 );
    return pNew;
}